

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O3

aom_codec_err_t encoder_init(aom_codec_ctx_t *ctx)

{
  aom_codec_enc_cfg_t *cfg;
  av1_extracfg *extra_cfg;
  AV1EncoderConfig *oxcf;
  uint uVar1;
  aom_codec_err_t aVar2;
  uint uVar3;
  int iVar4;
  aom_codec_alg_priv_t_conflict *ctx_00;
  ulong uVar5;
  AV1_PRIMARY *pAVar6;
  FIRSTPASS_STATS *pFVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  
  aVar2 = AOM_CODEC_OK;
  if (ctx->priv == (aom_codec_priv_t *)0x0) {
    ctx_00 = (aom_codec_alg_priv_t_conflict *)aom_calloc(1,0xb528);
    if (ctx_00 != (aom_codec_alg_priv_t_conflict *)0x0) {
      ctx->priv = (aom_codec_priv_t *)ctx_00;
      (ctx_00->base).init_flags = ctx->init_flags;
      cfg = &ctx_00->cfg;
      memcpy(cfg,(ctx->config).raw,0x388);
      (ctx->config).dec = (aom_codec_dec_cfg *)cfg;
      extra_cfg = &ctx_00->extra_cfg;
      memcpy(extra_cfg,&default_extra_cfg,600);
      uVar3 = (ctx_00->cfg).g_usage;
      if (uVar3 == 2) {
        (ctx_00->extra_cfg).enable_cdef = 0;
        (ctx_00->extra_cfg).qm_min = 4;
        (ctx_00->extra_cfg).qm_max = 10;
      }
      av1_initialize_enc(uVar3,(ctx_00->cfg).rc_end_usage);
      aVar2 = validate_config(ctx_00,cfg,extra_cfg);
      if (aVar2 != AOM_CODEC_OK) {
        return aVar2;
      }
      ctx_00->num_lap_buffers = 0;
      uVar3 = (ctx_00->cfg).g_timebase.den;
      uVar12 = (long)(ctx_00->cfg).g_timebase.num * 10000000;
      uVar9 = uVar12;
      if (0 < (int)uVar3) {
        uVar11 = (ulong)uVar3;
        uVar5 = uVar12;
        do {
          uVar9 = uVar11 & 0xffffffff;
          uVar11 = (long)uVar5 % (long)uVar9;
          uVar5 = uVar9;
        } while (0 < (long)uVar11);
      }
      (ctx_00->timestamp_ratio).num = (long)uVar12 / (long)(int)uVar9;
      (ctx_00->timestamp_ratio).den = (int)uVar3 / (int)uVar9;
      oxcf = &ctx_00->oxcf;
      set_encoder_config(oxcf,cfg,extra_cfg);
      iVar13 = 0;
      if ((((ctx_00->oxcf).rc_cfg.mode != AOM_CBR) &&
          (iVar13 = 0, (ctx_00->oxcf).pass == AOM_RC_ONE_PASS)) && ((ctx_00->oxcf).mode == '\0')) {
        iVar13 = (ctx_00->oxcf).kf_cfg.key_freq_max;
        uVar3 = 0x30;
        if (iVar13 < 0x21) {
          uVar3 = iVar13 + 0x10;
        }
        uVar1 = (ctx_00->cfg).g_lag_in_frames;
        if ((int)uVar1 < (int)uVar3) {
          uVar3 = uVar1;
        }
        ctx_00->num_lap_buffers = uVar3;
        iVar13 = 0x11;
        if ((int)(uVar1 - uVar3) < 0x11) {
          iVar13 = 0;
        }
      }
      (ctx_00->oxcf).use_highbitdepth = (_Bool)((byte)((uint)ctx->init_flags >> 0x12) & 1);
      ctx_00->monochrome_on_init = (ctx_00->cfg).monochrome != 0;
      pAVar6 = av1_create_primary_compressor(&(ctx_00->pkt_list).head,ctx_00->num_lap_buffers,oxcf);
      ctx_00->ppi = pAVar6;
      if (pAVar6 != (AV1_PRIMARY *)0x0) {
        iVar4 = 0x30;
        if (0 < ctx_00->num_lap_buffers) {
          iVar4 = ctx_00->num_lap_buffers + 1;
        }
        pFVar7 = (FIRSTPASS_STATS *)aom_calloc((long)iVar4,0xe8);
        ctx_00->frame_stats_buffer = pFVar7;
        if (pFVar7 != (FIRSTPASS_STATS *)0x0) {
          (ctx_00->stats_buf_context).stats_in_start = pFVar7;
          (ctx_00->stats_buf_context).stats_in_end = pFVar7;
          (ctx_00->stats_buf_context).stats_in_buf_end = pFVar7 + iVar4;
          pFVar7 = (FIRSTPASS_STATS *)aom_calloc(1,0xe8);
          (ctx_00->stats_buf_context).total_left_stats = pFVar7;
          if (pFVar7 != (FIRSTPASS_STATS *)0x0) {
            av1_twopass_zero_stats(pFVar7);
            pFVar7 = (FIRSTPASS_STATS *)aom_calloc(1,0xe8);
            (ctx_00->stats_buf_context).total_stats = pFVar7;
            if (pFVar7 == (FIRSTPASS_STATS *)0x0) {
              return AOM_CODEC_MEM_ERROR;
            }
            av1_twopass_zero_stats(pFVar7);
            iVar4 = ctx_00->num_lap_buffers;
            lVar8 = 0;
            iVar10 = 0;
            if (0 < iVar4) {
              iVar10 = iVar4;
            }
            uVar9 = 0x30;
            if (0 < iVar4) {
              uVar9 = (ulong)(iVar10 + 1);
            }
            uVar12 = 0;
            do {
              (ctx_00->ppi->twopass).frame_stats_arr[uVar12] =
                   (FIRSTPASS_STATS *)((long)&ctx_00->frame_stats_buffer->frame + lVar8);
              uVar12 = uVar12 + 1;
              lVar8 = lVar8 + 0xe8;
            } while (uVar9 != uVar12);
            pAVar6 = ctx_00->ppi;
            (pAVar6->twopass).stats_buf_ctx = &ctx_00->stats_buf_context;
            aVar2 = av1_create_context_and_bufferpool
                              (pAVar6,pAVar6->parallel_cpi,&ctx_00->buffer_pool,oxcf,'\0',-1);
            if (aVar2 != AOM_CODEC_OK) {
              (ctx_00->base).err_detail = "av1_create_context_and_bufferpool() failed";
              return aVar2;
            }
            pAVar6 = ctx_00->ppi;
            (pAVar6->parallel_cpi[0]->twopass_frame).stats_in =
                 ((pAVar6->twopass).stats_buf_ctx)->stats_in_start;
            pAVar6->cpi = pAVar6->parallel_cpi[0];
            if (ctx_00->num_lap_buffers == 0) {
              return AOM_CODEC_OK;
            }
            aVar2 = av1_create_context_and_bufferpool
                              (pAVar6,&pAVar6->cpi_lap,&ctx_00->buffer_pool_lap,oxcf,'\x01',iVar13);
            return aVar2;
          }
        }
      }
    }
    aVar2 = AOM_CODEC_MEM_ERROR;
  }
  return aVar2;
}

Assistant:

static aom_codec_err_t encoder_init(aom_codec_ctx_t *ctx) {
  aom_codec_err_t res = AOM_CODEC_OK;

  if (ctx->priv == NULL) {
    aom_codec_alg_priv_t *const priv = aom_calloc(1, sizeof(*priv));
    if (priv == NULL) return AOM_CODEC_MEM_ERROR;

    ctx->priv = (aom_codec_priv_t *)priv;
    ctx->priv->init_flags = ctx->init_flags;

    // Update the reference to the config structure to an internal copy.
    assert(ctx->config.enc);
    priv->cfg = *ctx->config.enc;
    ctx->config.enc = &priv->cfg;

    priv->extra_cfg = default_extra_cfg;
    // Special handling:
    // By default, if omitted: --enable-cdef=1, --qm-min=5, and --qm-max=9
    // Here we set its default values to 0, 4, and 10 respectively when
    // --allintra is turned on.
    // However, if users set --enable-cdef, --qm-min, or --qm-max, either from
    // the command line or aom_codec_control(), the encoder still respects it.
    if (priv->cfg.g_usage == AOM_USAGE_ALL_INTRA) {
      // CDEF has been found to blur images, so it's disabled in all-intra mode
      priv->extra_cfg.enable_cdef = 0;
      // These QM min/max values have been found to be beneficial for images,
      // when used with an alternative QM formula (see
      // aom_get_qmlevel_allintra()).
      // These values could also be beneficial for other usage modes, but
      // further testing is required.
      priv->extra_cfg.qm_min = DEFAULT_QM_FIRST_ALLINTRA;
      priv->extra_cfg.qm_max = DEFAULT_QM_LAST_ALLINTRA;
    }
    av1_initialize_enc(priv->cfg.g_usage, priv->cfg.rc_end_usage);

    res = validate_config(priv, &priv->cfg, &priv->extra_cfg);

    if (res == AOM_CODEC_OK) {
      int *num_lap_buffers = &priv->num_lap_buffers;
      int lap_lag_in_frames = 0;
      *num_lap_buffers = 0;
      priv->timestamp_ratio.den = priv->cfg.g_timebase.den;
      priv->timestamp_ratio.num =
          (int64_t)priv->cfg.g_timebase.num * TICKS_PER_SEC;
      reduce_ratio(&priv->timestamp_ratio);

      set_encoder_config(&priv->oxcf, &priv->cfg, &priv->extra_cfg);
      if (priv->oxcf.rc_cfg.mode != AOM_CBR &&
          priv->oxcf.pass == AOM_RC_ONE_PASS && priv->oxcf.mode == GOOD) {
        // Enable look ahead - enabled for AOM_Q, AOM_CQ, AOM_VBR
        *num_lap_buffers =
            AOMMIN((int)priv->cfg.g_lag_in_frames,
                   AOMMIN(MAX_LAP_BUFFERS, priv->oxcf.kf_cfg.key_freq_max +
                                               SCENE_CUT_KEY_TEST_INTERVAL));
        if ((int)priv->cfg.g_lag_in_frames - (*num_lap_buffers) >=
            LAP_LAG_IN_FRAMES) {
          lap_lag_in_frames = LAP_LAG_IN_FRAMES;
        }
      }
      priv->oxcf.use_highbitdepth =
          (ctx->init_flags & AOM_CODEC_USE_HIGHBITDEPTH) ? 1 : 0;

      priv->monochrome_on_init = priv->cfg.monochrome;

      priv->ppi = av1_create_primary_compressor(&priv->pkt_list.head,
                                                *num_lap_buffers, &priv->oxcf);
      if (!priv->ppi) return AOM_CODEC_MEM_ERROR;

#if !CONFIG_REALTIME_ONLY
      res = create_stats_buffer(&priv->frame_stats_buffer,
                                &priv->stats_buf_context, *num_lap_buffers);
      if (res != AOM_CODEC_OK) return res;

      assert(MAX_LAP_BUFFERS >= MAX_LAG_BUFFERS);
      int size = get_stats_buf_size(*num_lap_buffers, MAX_LAG_BUFFERS);
      for (int i = 0; i < size; i++)
        priv->ppi->twopass.frame_stats_arr[i] = &priv->frame_stats_buffer[i];

      priv->ppi->twopass.stats_buf_ctx = &priv->stats_buf_context;
#endif

      assert(priv->ppi->num_fp_contexts >= 1);
      res = av1_create_context_and_bufferpool(
          priv->ppi, &priv->ppi->parallel_cpi[0], &priv->buffer_pool,
          &priv->oxcf, ENCODE_STAGE, -1);
      if (res != AOM_CODEC_OK) {
        priv->base.err_detail = "av1_create_context_and_bufferpool() failed";
        return res;
      }
#if !CONFIG_REALTIME_ONLY
      priv->ppi->parallel_cpi[0]->twopass_frame.stats_in =
          priv->ppi->twopass.stats_buf_ctx->stats_in_start;
#endif
      priv->ppi->cpi = priv->ppi->parallel_cpi[0];

      // Create another compressor if look ahead is enabled
      if (res == AOM_CODEC_OK && *num_lap_buffers) {
        res = av1_create_context_and_bufferpool(
            priv->ppi, &priv->ppi->cpi_lap, &priv->buffer_pool_lap, &priv->oxcf,
            LAP_STAGE, clamp(lap_lag_in_frames, 0, MAX_LAG_BUFFERS));
      }
    }
  }

  return res;
}